

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_echo.c
# Opt level: O3

void handle_read(cio_io_stream *stream,void *handler_context,cio_error err,cio_read_buffer *buffer)

{
  cio_buffered_stream *buffered_stream;
  
  *(cio_error *)((long)handler_context + 0x90) = err;
  run_read((cio_buffered_stream *)handler_context);
  return;
}

Assistant:

static void handle_read(struct cio_io_stream *stream, void *handler_context, enum cio_error err, struct cio_read_buffer *read_buffer)
{
	struct echo_client *client = handler_context;
	if (err == CIO_EOF) {
		(void)fprintf(stdout, "connection close by peer\n");
		stream->close(stream);
		return;
	}

	if (err != CIO_SUCCESS) {
		(void)fprintf(stderr, "read error!\n");
		return;
	}

	cio_write_buffer_head_init(&client->wbh);
	size_t number_of_unread_bytes = cio_read_buffer_unread_bytes(read_buffer);
	client->number_of_bytes_read = number_of_unread_bytes;
	cio_write_buffer_element_init(&client->wb, cio_read_buffer_get_read_ptr(read_buffer), number_of_unread_bytes);
	cio_write_buffer_queue_tail(&client->wbh, &client->wb);
	cio_buffered_stream_write(&client->buffered_stream, &client->wbh, handle_write, client);
}